

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_test.cpp
# Opt level: O1

void flatbuffers::tests::ReflectionTest(string *tests_data_path,uint8_t *flatbuf,size_t length)

{
  uint uVar1;
  uoffset_t num_elems;
  pointer pcVar2;
  double dVar3;
  pointer puVar4;
  bool bVar5;
  ushort uVar6;
  unsigned_short uVar7;
  Offset<const_flatbuffers::Table_*> root;
  uint8_t *offset_location;
  uint *puVar8;
  Schema *pSVar9;
  Table *pTVar10;
  void *pvVar11;
  int *piVar12;
  long lVar13;
  Table *pTVar14;
  long lVar15;
  ulong uVar16;
  uint *puVar17;
  Vector<unsigned_char,_unsigned_int> *vec;
  uint8_t *puVar18;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec_00;
  long lVar19;
  unsigned_short vtsize;
  int *piVar20;
  char *__function;
  ushort uVar21;
  String *str;
  ulong uVar22;
  int *piVar23;
  Schema *pSVar24;
  Object *root_00;
  Table *table;
  BaseType BVar25;
  uint uVar26;
  Schema *pSVar27;
  Schema *schema;
  undefined4 uVar28;
  undefined4 uVar29;
  vector<unsigned_char,_std::allocator<unsigned_char>_> resizingbuf;
  string bfbsfile;
  FlatBufferBuilder stringfbb;
  string hp_string;
  Verifier resize_verifier;
  Verifier verifier;
  FlatBufferBuilder fbb;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_240;
  Schema *local_228;
  Schema *local_220;
  uint *local_218;
  size_t local_210;
  string local_208;
  undefined1 local_1e8 [32];
  size_t local_1c8;
  size_t local_1c0;
  uoffset_t local_1b8;
  uint8_t *local_1b0;
  undefined6 uStack_1a8;
  undefined2 uStack_1a2;
  undefined6 uStack_1a0;
  undefined8 uStack_19a;
  size_t local_190;
  undefined2 local_188;
  size_t local_180;
  undefined2 local_178;
  StringOffsetMap *local_170;
  Schema *local_168;
  string local_160;
  VerifierTemplate<false> local_140;
  VerifierTemplate<false> local_f8;
  FlatBufferBuilder local_b0;
  
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_208._M_string_length = 0;
  local_208.field_2._M_local_buf[0] = '\0';
  pcVar2 = (tests_data_path->_M_dataplus)._M_p;
  local_210 = length;
  local_1e8._0_8_ = local_1e8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e8,pcVar2,pcVar2 + tests_data_path->_M_string_length);
  std::__cxx11::string::append(local_1e8);
  bVar5 = LoadFile((char *)local_1e8._0_8_,true,&local_208);
  TestEq<bool,bool>(bVar5,true,
                    "\'flatbuffers::LoadFile((tests_data_path + \"monster_test.bfbs\").c_str(), true, &bfbsfile)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x17,"");
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  local_f8.buf_ = (uint8_t *)local_208._M_dataplus._M_p;
  local_f8.size_ = local_208._M_string_length;
  local_f8.opts_.max_depth = 0x40;
  local_f8.opts_.max_tables = 1000000;
  local_f8.opts_.check_alignment = true;
  local_f8.opts_.check_nested_flatbuffers = true;
  local_f8.opts_.max_size = 0x7fffffff;
  local_f8.opts_.assert = false;
  local_f8.upper_bound_ = 0;
  local_f8.depth_ = 0;
  local_f8.num_tables_ = 0;
  local_f8.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  if (0x7ffffffe < local_208._M_string_length) {
LAB_00191b7d:
    __assert_fail("size_ < opts.max_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/verifier.h"
                  ,0x2f,
                  "flatbuffers::VerifierTemplate<false>::VerifierTemplate(const uint8_t *const, const size_t, const Options &) [TrackVerifierBufferSize = false]"
                 );
  }
  bVar5 = VerifierTemplate<false>::VerifyBufferFromStart<reflection::Schema>(&local_f8,"BFBS",0);
  TestEq<bool,bool>(bVar5,true,"\'reflection::VerifySchemaBuffer(verifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x1c,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    schema = (Schema *)0x0;
  }
  else {
    schema = (Schema *)(local_208._M_dataplus._M_p + *(uint *)local_208._M_dataplus._M_p);
  }
  if (*(ushort *)(schema + -(long)*(int *)schema) < 0xd) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)(schema + (0xc - (long)*(int *)schema));
  }
  if (uVar6 == 0) {
    pSVar27 = (Schema *)0x0;
  }
  else {
    pSVar27 = schema + (ulong)*(uint *)(schema + uVar6) + (ulong)uVar6;
  }
  if (*(ushort *)(pSVar27 + -(long)*(int *)pSVar27) < 5) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)(pSVar27 + (4 - (long)*(int *)pSVar27));
  }
  TestEqStr((char *)(pSVar27 + (ulong)*(uint *)(pSVar27 + uVar6) + (ulong)uVar6 + 4),
            "MyGame.Example.Monster",
            "\'root_table->name()->c_str()\' != \'\"MyGame.Example.Monster\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x23,"");
  if (*(ushort *)(pSVar27 + -(long)*(int *)pSVar27) < 0x13) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)(pSVar27 + (0x12 - (long)*(int *)pSVar27));
  }
  TestEqStr((char *)(pSVar27 + (ulong)*(uint *)(pSVar27 + uVar6) + (ulong)uVar6 + 4),
            "//monster_test.fbs",
            "\'root_table->declaration_file()->c_str()\' != \'\"//monster_test.fbs\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x24,"");
  if (*(ushort *)(schema + -(long)*(int *)schema) < 5) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)(schema + (4 - (long)*(int *)schema));
  }
  local_1e8._0_8_ = "TableA";
  puVar8 = (uint *)bsearch(local_1e8,schema + (ulong)*(uint *)(schema + uVar6) + 4 + (ulong)uVar6,
                           (ulong)*(uint *)(schema + (ulong)*(uint *)(schema + uVar6) + 4 +
                                                     (ulong)uVar6 + -4),4,
                           Vector<flatbuffers::Offset<reflection::Object>,unsigned_int>::
                           KeyCompare<char_const*>);
  if (puVar8 == (uint *)0x0) {
    piVar20 = (int *)0x0;
  }
  else {
    piVar20 = (int *)((ulong)*puVar8 + (long)puVar8);
  }
  if (*(ushort *)((long)piVar20 - (long)*piVar20) < 0x13) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)((long)piVar20 + (0x12 - (long)*piVar20));
  }
  TestEqStr((char *)((long)piVar20 +
                    (ulong)*(uint *)((long)piVar20 + (ulong)uVar6) + (ulong)uVar6 + 4),
            "//include_test/include_test1.fbs",
            "\'schema.objects()->LookupByKey(\"TableA\")->declaration_file()->c_str()\' != \'\"//include_test/include_test1.fbs\"\'"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x27,"");
  if (*(ushort *)(schema + -(long)*(int *)schema) < 5) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)(schema + (4 - (long)*(int *)schema));
  }
  local_1e8._0_8_ = "MyGame.OtherNameSpace.Unused";
  puVar8 = (uint *)bsearch(local_1e8,schema + (ulong)*(uint *)(schema + uVar6) + 4 + (ulong)uVar6,
                           (ulong)*(uint *)(schema + (ulong)*(uint *)(schema + uVar6) + 4 +
                                                     (ulong)uVar6 + -4),4,
                           Vector<flatbuffers::Offset<reflection::Object>,unsigned_int>::
                           KeyCompare<char_const*>);
  if (puVar8 == (uint *)0x0) {
    piVar20 = (int *)0x0;
  }
  else {
    piVar20 = (int *)((ulong)*puVar8 + (long)puVar8);
  }
  if (*(ushort *)((long)piVar20 - (long)*piVar20) < 0x13) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)((long)piVar20 + (0x12 - (long)*piVar20));
  }
  TestEqStr((char *)((long)piVar20 +
                    (ulong)*(uint *)((long)piVar20 + (ulong)uVar6) + (ulong)uVar6 + 4),
            "//include_test/sub/include_test2.fbs",
            "\'schema.objects() ->LookupByKey(\"MyGame.OtherNameSpace.Unused\") ->declaration_file() ->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x2c,"");
  if (*(ushort *)(schema + -(long)*(int *)schema) < 7) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)(schema + (6 - (long)*(int *)schema));
  }
  local_1e8._0_8_ = "MyGame.OtherNameSpace.FromInclude";
  puVar8 = (uint *)bsearch(local_1e8,schema + (ulong)*(uint *)(schema + uVar6) + 4 + (ulong)uVar6,
                           (ulong)*(uint *)(schema + (ulong)*(uint *)(schema + uVar6) + 4 +
                                                     (ulong)uVar6 + -4),4,
                           Vector<flatbuffers::Offset<reflection::Enum>,unsigned_int>::
                           KeyCompare<char_const*>);
  if (puVar8 == (uint *)0x0) {
    piVar20 = (int *)0x0;
  }
  else {
    piVar20 = (int *)((ulong)*puVar8 + (long)puVar8);
  }
  if (*(ushort *)((long)piVar20 - (long)*piVar20) < 0x11) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)((long)piVar20 + (0x10 - (long)*piVar20));
  }
  TestEqStr((char *)((long)piVar20 +
                    (ulong)*(uint *)((long)piVar20 + (ulong)uVar6) + (ulong)uVar6 + 4),
            "//include_test/sub/include_test2.fbs",
            "\'schema.enums() ->LookupByKey(\"MyGame.OtherNameSpace.FromInclude\") ->declaration_file() ->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x31,"");
  if (*(ushort *)(schema + -(long)*(int *)schema) < 0x13) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)(schema + (0x12 - (long)*(int *)schema));
  }
  TestEq<unsigned_int,int>
            (*(uint *)(schema + (ulong)*(uint *)(schema + uVar6) + (ulong)uVar6),3,
             "\'schema.fbs_files()->size()\' != \'3\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
             ,0x34,"");
  if (*(ushort *)(schema + -(long)*(int *)schema) < 0x13) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)(schema + (0x12 - (long)*(int *)schema));
  }
  if (uVar6 == 0) {
    pSVar9 = (Schema *)0x0;
  }
  else {
    pSVar9 = schema + (ulong)*(uint *)(schema + uVar6) + (ulong)uVar6;
  }
  if (*(int *)pSVar9 == 0) {
LAB_00191b63:
    __function = 
    "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::SchemaFile>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::SchemaFile>, SizeT = unsigned int]"
    ;
  }
  else {
    uVar26 = *(uint *)(pSVar9 + 4);
    pSVar24 = pSVar9 + (ulong)uVar26 + 4;
    if (*(ushort *)(pSVar24 + -(long)*(int *)pSVar24) < 5) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)(pSVar9 + (((ulong)uVar26 + 8) - (long)*(int *)pSVar24));
    }
    TestEqStr((char *)(pSVar24 + (ulong)*(uint *)(pSVar24 + uVar6) + (ulong)uVar6 + 4),
              "//include_test/include_test1.fbs",
              "\'fbs0->filename()->c_str()\' != \'\"//include_test/include_test1.fbs\"\'",
              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
              ,0x37,"");
    if (*(ushort *)(pSVar24 + -(long)*(int *)pSVar24) < 7) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)(pSVar9 + (((ulong)uVar26 + 10) - (long)*(int *)pSVar24));
    }
    if (uVar6 == 0) {
      pSVar24 = (Schema *)0x0;
    }
    else {
      pSVar24 = pSVar24 + (ulong)*(uint *)(pSVar24 + uVar6) + (ulong)uVar6;
    }
    TestEq<unsigned_int,int>
              (*(uint *)pSVar24,2,"\'fbs0_includes->size()\' != \'2\'",
               "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
               ,0x39,"");
    if ((*(uint *)pSVar24 != 0) &&
       (TestEqStr((char *)(pSVar24 + (ulong)*(uint *)(pSVar24 + 4) + 8),
                  "//include_test/include_test1.fbs",
                  "\'fbs0_includes->Get(0)->c_str()\' != \'\"//include_test/include_test1.fbs\"\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                  ,0x3d,""), 1 < *(uint *)pSVar24)) {
      TestEqStr((char *)(pSVar24 + (ulong)*(uint *)(pSVar24 + 8) + 0xc),
                "//include_test/sub/include_test2.fbs",
                "\'fbs0_includes->Get(1)->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                ,0x3f,"");
      if (*(ushort *)(schema + -(long)*(int *)schema) < 0x13) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(ushort *)(schema + (0x12 - (long)*(int *)schema));
      }
      if (uVar6 == 0) {
        pSVar9 = (Schema *)0x0;
      }
      else {
        pSVar9 = schema + (ulong)*(uint *)(schema + uVar6) + (ulong)uVar6;
      }
      if (*(uint *)pSVar9 < 2) goto LAB_00191b63;
      uVar26 = *(uint *)(pSVar9 + 8);
      pSVar24 = pSVar9 + (ulong)uVar26 + 8;
      if (*(ushort *)(pSVar24 + -(long)*(int *)pSVar24) < 5) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(ushort *)(pSVar9 + (((ulong)uVar26 + 0xc) - (long)*(int *)pSVar24));
      }
      TestEqStr((char *)(pSVar24 + (ulong)*(uint *)(pSVar24 + uVar6) + (ulong)uVar6 + 4),
                "//include_test/sub/include_test2.fbs",
                "\'fbs1->filename()->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                ,0x43,"");
      if (*(ushort *)(pSVar24 + -(long)*(int *)pSVar24) < 7) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(ushort *)(pSVar9 + (((ulong)uVar26 + 0xe) - (long)*(int *)pSVar24));
      }
      if (uVar6 == 0) {
        pSVar24 = (Schema *)0x0;
      }
      else {
        pSVar24 = pSVar24 + (ulong)*(uint *)(pSVar24 + uVar6) + (ulong)uVar6;
      }
      TestEq<unsigned_int,int>
                (*(uint *)pSVar24,2,"\'fbs1_includes->size()\' != \'2\'",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                 ,0x45,"");
      if ((*(uint *)pSVar24 != 0) &&
         (TestEqStr((char *)(pSVar24 + (ulong)*(uint *)(pSVar24 + 4) + 8),
                    "//include_test/include_test1.fbs",
                    "\'fbs1_includes->Get(0)->c_str()\' != \'\"//include_test/include_test1.fbs\"\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x47,""), 1 < *(uint *)pSVar24)) {
        TestEqStr((char *)(pSVar24 + (ulong)*(uint *)(pSVar24 + 8) + 0xc),
                  "//include_test/sub/include_test2.fbs",
                  "\'fbs1_includes->Get(1)->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                  ,0x49,"");
        if (*(ushort *)(schema + -(long)*(int *)schema) < 0x13) {
          uVar6 = 0;
        }
        else {
          uVar6 = *(ushort *)(schema + (0x12 - (long)*(int *)schema));
        }
        if (uVar6 == 0) {
          pSVar9 = (Schema *)0x0;
        }
        else {
          pSVar9 = schema + (ulong)*(uint *)(schema + uVar6) + (ulong)uVar6;
        }
        if (*(uint *)pSVar9 < 3) goto LAB_00191b63;
        uVar26 = *(uint *)(pSVar9 + 0xc);
        pSVar24 = pSVar9 + (ulong)uVar26 + 0xc;
        if (*(ushort *)(pSVar24 + -(long)*(int *)pSVar24) < 5) {
          uVar6 = 0;
        }
        else {
          uVar6 = *(ushort *)(pSVar9 + (((ulong)uVar26 + 0x10) - (long)*(int *)pSVar24));
        }
        TestEqStr((char *)(pSVar24 + (ulong)*(uint *)(pSVar24 + uVar6) + (ulong)uVar6 + 4),
                  "//monster_test.fbs","\'fbs2->filename()->c_str()\' != \'\"//monster_test.fbs\"\'"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                  ,0x4c,"");
        if (*(ushort *)(pSVar24 + -(long)*(int *)pSVar24) < 7) {
          uVar6 = 0;
        }
        else {
          uVar6 = *(ushort *)(pSVar9 + (((ulong)uVar26 + 0x12) - (long)*(int *)pSVar24));
        }
        if (uVar6 == 0) {
          pSVar24 = (Schema *)0x0;
        }
        else {
          pSVar24 = pSVar24 + (ulong)*(uint *)(pSVar24 + uVar6) + (ulong)uVar6;
        }
        TestEq<unsigned_int,int>
                  (*(uint *)pSVar24,1,"\'fbs2_includes->size()\' != \'1\'",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                   ,0x4e,"");
        if (*(uint *)pSVar24 != 0) {
          TestEqStr((char *)(pSVar24 + (ulong)*(uint *)(pSVar24 + 4) + 8),
                    "//include_test/include_test1.fbs",
                    "\'fbs2_includes->Get(0)->c_str()\' != \'\"//include_test/include_test1.fbs\"\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x50,"");
          if (*(ushort *)(pSVar27 + -(long)*(int *)pSVar27) < 7) {
            uVar6 = 0;
          }
          else {
            uVar6 = *(ushort *)(pSVar27 + (6 - (long)*(int *)pSVar27));
          }
          if (uVar6 == 0) {
            pSVar9 = (Schema *)0x0;
          }
          else {
            pSVar9 = pSVar27 + (ulong)*(uint *)(pSVar27 + uVar6) + (ulong)uVar6;
          }
          local_1e8._0_8_ = "hp";
          local_228 = pSVar9 + 4;
          local_218 = (uint *)flatbuf;
          local_168 = pSVar27;
          puVar8 = (uint *)bsearch(local_1e8,local_228,(ulong)*(uint *)pSVar9,4,
                                   Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::
                                   KeyCompare<char_const*>);
          if (puVar8 == (uint *)0x0) {
            table = (Table *)0x0;
          }
          else {
            table = (Table *)((ulong)*puVar8 + (long)puVar8);
          }
          TestEq<bool,bool>(true,table != (Table *)0x0,"\'nullptr\' == \'hp_field_ptr\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                            ,0x55,"");
          if (*(ushort *)(table + -(long)*(int *)table) < 5) {
            uVar6 = 0;
          }
          else {
            uVar6 = *(ushort *)(table + (4 - (long)*(int *)table));
          }
          TestEqStr((char *)(table + (ulong)*(uint *)(table + uVar6) + (ulong)uVar6 + 4),"hp",
                    "\'hp_field.name()->c_str()\' != \'\"hp\"\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x57,"");
          if (*(ushort *)(table + -(long)*(int *)table) < 9) {
            uVar6 = 0;
          }
          else {
            uVar6 = *(ushort *)(table + (8 - (long)*(int *)table));
          }
          if (uVar6 == 0) {
            uVar7 = 0;
          }
          else {
            uVar7 = *(unsigned_short *)(table + uVar6);
          }
          TestEq<unsigned_short,int>
                    (uVar7,2,"\'hp_field.id()\' != \'2\'",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                     ,0x58,"");
          if (*(ushort *)(table + -(long)*(int *)table) < 7) {
            uVar6 = 0;
          }
          else {
            uVar6 = *(ushort *)(table + (6 - (long)*(int *)table));
          }
          if (uVar6 == 0) {
            pTVar10 = (Table *)0x0;
          }
          else {
            pTVar10 = table + (ulong)*(uint *)(table + uVar6) + (ulong)uVar6;
          }
          BVar25 = None;
          uVar6 = 0;
          if (4 < *(ushort *)(pTVar10 + -(long)*(int *)pTVar10)) {
            uVar6 = *(ushort *)(pTVar10 + (4 - (long)*(int *)pTVar10));
          }
          if (uVar6 != 0) {
            BVar25 = (BaseType)(char)pTVar10[uVar6];
          }
          TestEq<reflection::BaseType,reflection::BaseType>
                    (BVar25,Short,"\'hp_field.type()->base_type()\' != \'reflection::Short\'",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                     ,0x59,"");
          local_1e8._0_8_ = "friendly";
          puVar8 = (uint *)bsearch(local_1e8,local_228,(ulong)*(uint *)pSVar9,4,
                                   Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::
                                   KeyCompare<char_const*>);
          if (puVar8 == (uint *)0x0) {
            piVar20 = (int *)0x0;
          }
          else {
            piVar20 = (int *)((ulong)*puVar8 + (long)puVar8);
          }
          TestEq<bool,bool>(true,piVar20 != (int *)0x0,"\'nullptr\' == \'friendly_field_ptr\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                            ,0x5c,"");
          if (*(ushort *)((long)piVar20 - (long)*piVar20) < 0x17) {
            bVar5 = false;
          }
          else {
            bVar5 = *(short *)((long)piVar20 + (0x16 - (long)*piVar20)) != 0;
          }
          TestEq<bool,bool>(true,bVar5,"\'nullptr\' == \'friendly_field_ptr->attributes()\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                            ,0x5d,"");
          if (*(ushort *)((long)piVar20 - (long)*piVar20) < 0x17) {
            uVar6 = 0;
          }
          else {
            uVar6 = *(ushort *)((long)piVar20 + (0x16 - (long)*piVar20));
          }
          local_1e8._0_8_ = "priority";
          pvVar11 = (void *)((long)piVar20 +
                            (ulong)*(uint *)((long)piVar20 + (ulong)uVar6) + 4 + (ulong)uVar6);
          pvVar11 = bsearch(local_1e8,pvVar11,(ulong)*(uint *)((long)pvVar11 + -4),4,
                            Vector<flatbuffers::Offset<reflection::KeyValue>,unsigned_int>::
                            KeyCompare<char_const*>);
          TestEq<bool,bool>(true,pvVar11 != (void *)0x0,
                            "\'nullptr\' == \'friendly_field_ptr->attributes()->LookupByKey(\"priority\")\'"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                            ,0x5e,"");
          local_1e8._0_8_ = "pos";
          puVar8 = (uint *)bsearch(local_1e8,local_228,(ulong)*(uint *)pSVar9,4,
                                   Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::
                                   KeyCompare<char_const*>);
          if (puVar8 == (uint *)0x0) {
            piVar20 = (int *)0x0;
          }
          else {
            piVar20 = (int *)((ulong)*puVar8 + (long)puVar8);
          }
          TestEq<bool,bool>(true,piVar20 != (int *)0x0,"\'nullptr\' == \'pos_field_ptr\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                            ,0x62,"");
          if (*(ushort *)((long)piVar20 - (long)*piVar20) < 7) {
            uVar6 = 0;
          }
          else {
            uVar6 = *(ushort *)((long)piVar20 + (6 - (long)*piVar20));
          }
          if (uVar6 == 0) {
            piVar12 = (int *)0x0;
          }
          else {
            piVar12 = (int *)((long)piVar20 +
                             (ulong)*(uint *)((long)piVar20 + (ulong)uVar6) + (ulong)uVar6);
          }
          BVar25 = None;
          uVar6 = 0;
          if (4 < *(ushort *)((long)piVar12 - (long)*piVar12)) {
            uVar6 = *(ushort *)((long)piVar12 + (4 - (long)*piVar12));
          }
          if (uVar6 != 0) {
            BVar25 = (BaseType)*(char *)((long)piVar12 + (ulong)uVar6);
          }
          TestEq<reflection::BaseType,reflection::BaseType>
                    (BVar25,Obj,"\'pos_field_ptr->type()->base_type()\' != \'reflection::Obj\'",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                     ,99,"");
          if (*(ushort *)(schema + -(long)*(int *)schema) < 5) {
            uVar6 = 0;
          }
          else {
            uVar6 = *(ushort *)(schema + (4 - (long)*(int *)schema));
          }
          if (uVar6 == 0) {
            pSVar27 = (Schema *)0x0;
          }
          else {
            pSVar27 = schema + (ulong)*(uint *)(schema + uVar6) + (ulong)uVar6;
          }
          if (*(ushort *)((long)piVar20 - (long)*piVar20) < 7) {
            uVar6 = 0;
          }
          else {
            uVar6 = *(ushort *)((long)piVar20 + (6 - (long)*piVar20));
          }
          if (uVar6 == 0) {
            piVar12 = (int *)0x0;
          }
          else {
            piVar12 = (int *)((long)piVar20 +
                             (ulong)*(uint *)((long)piVar20 + (ulong)uVar6) + (ulong)uVar6);
          }
          if (*(ushort *)((long)piVar12 - (long)*piVar12) < 9) {
            uVar6 = 0;
          }
          else {
            uVar6 = *(ushort *)((long)piVar12 + (8 - (long)*piVar12));
          }
          if (uVar6 == 0) {
            uVar26 = 0xffffffff;
          }
          else {
            uVar26 = *(uint *)((long)piVar12 + (ulong)uVar6);
          }
          local_220 = pSVar9;
          if (uVar26 < *(uint *)pSVar27) {
            uVar1 = *(uint *)(pSVar27 + (ulong)(uVar26 << 2) + 4);
            TestEq<bool,bool>(true,true,"\'nullptr\' == \'pos_table_ptr\'",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                              ,0x65,"");
            lVar15 = (ulong)uVar1 + (ulong)(uVar26 << 2);
            pSVar9 = pSVar27 + lVar15 + 4;
            if (*(ushort *)(pSVar9 + -(long)*(int *)pSVar9) < 5) {
              uVar6 = 0;
            }
            else {
              uVar6 = *(ushort *)(pSVar27 + ((lVar15 + 8) - (long)*(int *)pSVar9));
            }
            TestEqStr((char *)(pSVar9 + (ulong)*(uint *)(pSVar9 + uVar6) + (ulong)uVar6 + 4),
                      "MyGame.Example.Vec3",
                      "\'pos_table_ptr->name()->c_str()\' != \'\"MyGame.Example.Vec3\"\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                      ,0x66,"");
            if (*(ushort *)(table + -(long)*(int *)table) < 0x1b) {
              uVar6 = 0;
            }
            else {
              uVar6 = *(ushort *)(table + (0x1a - (long)*(int *)table));
            }
            if (uVar6 == 0) {
              bVar5 = false;
            }
            else {
              bVar5 = table[uVar6] != (Table)0x0;
            }
            TestEq<bool,bool>(bVar5,false,"\'hp_field.optional()\' != \'false\'",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                              ,0x6a,"");
            if (*(ushort *)((long)piVar20 - (long)*piVar20) < 0x1b) {
              uVar6 = 0;
            }
            else {
              uVar6 = *(ushort *)((long)piVar20 + (0x1a - (long)*piVar20));
            }
            if (uVar6 == 0) {
              bVar5 = false;
            }
            else {
              bVar5 = *(char *)((long)piVar20 + (ulong)uVar6) != '\0';
            }
            TestEq<bool,bool>(bVar5,true,"\'pos_field_ptr->optional()\' != \'true\'",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                              ,0x6b,"");
            local_1e8._0_8_ = "name";
            puVar8 = (uint *)bsearch(local_1e8,local_228,(ulong)*(uint *)local_220,4,
                                     Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::
                                     KeyCompare<char_const*>);
            if (puVar8 == (uint *)0x0) {
              piVar12 = (int *)0x0;
            }
            else {
              piVar12 = (int *)((ulong)*puVar8 + (long)puVar8);
            }
            if (*(ushort *)((long)piVar12 - (long)*piVar12) < 0x1b) {
              uVar6 = 0;
            }
            else {
              uVar6 = *(ushort *)((long)piVar12 + (0x1a - (long)*piVar12));
            }
            if (uVar6 == 0) {
              bVar5 = false;
            }
            else {
              bVar5 = *(char *)((long)piVar12 + (ulong)uVar6) != '\0';
            }
            TestEq<bool,bool>(bVar5,false,
                              "\'fields->LookupByKey(\"name\")->optional()\' != \'false\'",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                              ,0x6c,"");
            if (local_218 == (uint *)0x0) {
              pTVar10 = (Table *)0x0;
            }
            else {
              pTVar10 = (Table *)((ulong)*local_218 + (long)local_218);
            }
            if (*(ushort *)(schema + -(long)*(int *)schema) < 0xd) {
              uVar6 = 0;
            }
            else {
              uVar6 = *(ushort *)(schema + (0xc - (long)*(int *)schema));
            }
            bVar5 = flatbuffers::Verify(schema,(Object *)
                                               (schema + (ulong)*(uint *)(schema + uVar6) +
                                                         (ulong)uVar6),(uint8_t *)local_218,
                                        local_210,0x40,1000000);
            TestEq<bool,bool>(bVar5,true,
                              "\'flatbuffers::Verify(schema, *schema.root_table(), flatbuf, length)\' != \'true\'"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                              ,0x73,"");
            uVar7 = GetFieldI<unsigned_short>(pTVar10,(Field *)table);
            TestEq<unsigned_short,int>
                      (uVar7,0x50,"\'hp\' != \'80\'",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                       ,0x76,"");
            lVar13 = -(long)*(int *)table;
            uVar6 = *(ushort *)(table + -(long)*(int *)table);
            if (uVar6 < 0xb) {
              uVar21 = 0;
            }
            else {
              uVar21 = *(ushort *)(table + lVar13 + 10);
            }
            if (uVar21 == 0) {
              uVar21 = 0;
            }
            else {
              uVar21 = *(ushort *)(table + uVar21);
            }
            if (uVar21 < *(ushort *)(pTVar10 + -(long)*(int *)pTVar10)) {
              uVar21 = *(ushort *)(pTVar10 + ((ulong)uVar21 - (long)*(int *)pTVar10));
            }
            else {
              uVar21 = 0;
            }
            if (uVar21 == 0) {
              if (uVar6 < 0xd) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)(table + lVar13 + 0xc);
              }
              if (uVar6 == 0) {
                lVar13 = 0;
              }
              else {
                lVar13 = *(long *)(table + uVar6);
              }
            }
            else {
              if (uVar6 < 7) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)(table + lVar13 + 6);
              }
              if (uVar6 == 0) {
                pTVar14 = (Table *)0x0;
              }
              else {
                pTVar14 = table + (ulong)*(uint *)(table + uVar6) + (ulong)uVar6;
              }
              BVar25 = None;
              uVar6 = 0;
              if (4 < *(ushort *)(pTVar14 + -(long)*(int *)pTVar14)) {
                uVar6 = *(ushort *)(pTVar14 + (4 - (long)*(int *)pTVar14));
              }
              if (uVar6 != 0) {
                BVar25 = (BaseType)(char)pTVar14[uVar6];
              }
              lVar13 = GetAnyValueI(BVar25,(uint8_t *)(pTVar10 + uVar21));
            }
            pSVar24 = (Schema *)0x7b;
            TestEq<long,int>(lVar13,0x50,"\'hp_int64\' != \'80\'",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                             ,0x7b,"");
            lVar13 = -(long)*(int *)table;
            uVar6 = *(ushort *)(table + -(long)*(int *)table);
            if (uVar6 < 0xb) {
              uVar21 = 0;
            }
            else {
              uVar21 = *(ushort *)(table + lVar13 + 10);
            }
            if (uVar21 == 0) {
              uVar21 = 0;
            }
            else {
              uVar21 = *(ushort *)(table + uVar21);
            }
            if (uVar21 < *(ushort *)(pTVar10 + -(long)*(int *)pTVar10)) {
              uVar21 = *(ushort *)(pTVar10 + ((ulong)uVar21 - (long)*(int *)pTVar10));
            }
            else {
              uVar21 = 0;
            }
            if (uVar21 == 0) {
              if (uVar6 < 0xf) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)(table + lVar13 + 0xe);
              }
              if (uVar6 == 0) {
                uVar28 = 0;
                uVar29 = 0;
              }
              else {
                uVar28 = (undefined4)*(undefined8 *)(table + uVar6);
                uVar29 = (undefined4)((ulong)*(undefined8 *)(table + uVar6) >> 0x20);
              }
            }
            else {
              if (uVar6 < 7) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)(table + lVar13 + 6);
              }
              if (uVar6 == 0) {
                pTVar14 = (Table *)0x0;
              }
              else {
                pTVar14 = table + (ulong)*(uint *)(table + uVar6) + (ulong)uVar6;
              }
              BVar25 = None;
              uVar6 = 0;
              if (4 < *(ushort *)(pTVar14 + -(long)*(int *)pTVar14)) {
                uVar6 = *(ushort *)(pTVar14 + (4 - (long)*(int *)pTVar14));
              }
              if (uVar6 != 0) {
                BVar25 = (BaseType)(char)pTVar14[uVar6];
              }
              dVar3 = GetAnyValueF(BVar25,(uint8_t *)(pTVar10 + uVar21));
              uVar28 = SUB84(dVar3,0);
              uVar29 = (undefined4)((ulong)dVar3 >> 0x20);
            }
            TestEq<double,double>
                      ((double)CONCAT44(uVar29,uVar28),80.0,"\'hp_double\' != \'80.0\'",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                       ,0x7d,"");
            GetAnyFieldS_abi_cxx11_(&local_160,(flatbuffers *)pTVar10,table,(Field *)schema,pSVar24)
            ;
            TestEqStr(local_160._M_dataplus._M_p,"80","\'hp_string.c_str()\' != \'\"80\"\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                      ,0x7f,"");
            lVar13 = -(long)*piVar20;
            uVar6 = *(ushort *)((long)piVar20 - (long)*piVar20);
            if (uVar6 < 7) {
              uVar21 = 0;
            }
            else {
              uVar21 = *(ushort *)((long)piVar20 + lVar13 + 6);
            }
            if (uVar21 == 0) {
              piVar12 = (int *)0x0;
            }
            else {
              piVar12 = (int *)((long)piVar20 +
                               (ulong)*(uint *)((long)piVar20 + (ulong)uVar21) + (ulong)uVar21);
            }
            if (*(ushort *)((long)piVar12 - (long)*piVar12) < 5) {
              uVar21 = 0;
            }
            else {
              uVar21 = *(ushort *)((long)piVar12 + (4 - (long)*piVar12));
            }
            if ((uVar21 == 0) || (*(char *)((long)piVar12 + (ulong)uVar21) != '\x0f')) {
              __assert_fail("field.type()->base_type() == reflection::Obj",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                            ,0xab,
                            "const Struct *flatbuffers::GetFieldStruct(const Table &, const reflection::Field &)"
                           );
            }
            if (uVar6 < 0xb) {
              uVar6 = 0;
            }
            else {
              uVar6 = *(ushort *)((long)piVar20 + lVar13 + 10);
            }
            if (uVar6 == 0) {
              uVar6 = 0;
            }
            else {
              uVar6 = *(ushort *)((long)piVar20 + (ulong)uVar6);
            }
            if (uVar6 < *(ushort *)(pTVar10 + -(long)*(int *)pTVar10)) {
              uVar6 = *(ushort *)(pTVar10 + ((ulong)uVar6 - (long)*(int *)pTVar10));
            }
            else {
              uVar6 = 0;
            }
            pTVar14 = (Table *)0x0;
            if (uVar6 != 0) {
              pTVar14 = pTVar10 + uVar6;
            }
            TestEq<bool,bool>(true,pTVar14 != (Table *)0x0,"\'nullptr\' == \'pos_struct\'",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                              ,0x83,"");
            if (*(ushort *)(pSVar9 + -(long)*(int *)pSVar9) < 7) {
              uVar6 = 0;
            }
            else {
              uVar6 = *(ushort *)(pSVar27 + ((lVar15 + 10) - (long)*(int *)pSVar9));
            }
            local_1e8._0_8_ = "z";
            puVar8 = (uint *)bsearch(local_1e8,
                                     pSVar9 + (ulong)*(uint *)(pSVar9 + uVar6) + 4 + (ulong)uVar6,
                                     (ulong)*(uint *)(pSVar9 + (ulong)*(uint *)(pSVar9 + uVar6) + 4
                                                               + (ulong)uVar6 + -4),4,
                                     Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::
                                     KeyCompare<char_const*>);
            if (puVar8 == (uint *)0x0) {
              piVar20 = (int *)0x0;
            }
            else {
              piVar20 = (int *)((ulong)*puVar8 + (long)puVar8);
            }
            lVar13 = -(long)*piVar20;
            uVar6 = *(ushort *)((long)piVar20 - (long)*piVar20);
            if (uVar6 < 7) {
              uVar21 = 0;
            }
            else {
              uVar21 = *(ushort *)((long)piVar20 + lVar13 + 6);
            }
            if (uVar21 == 0) {
              piVar12 = (int *)0x0;
            }
            else {
              piVar12 = (int *)((long)piVar20 +
                               (ulong)*(uint *)((long)piVar20 + (ulong)uVar21) + (ulong)uVar21);
            }
            BVar25 = None;
            uVar21 = 0;
            if (4 < *(ushort *)((long)piVar12 - (long)*piVar12)) {
              uVar21 = *(ushort *)((long)piVar12 + (4 - (long)*piVar12));
            }
            if (uVar21 != 0) {
              BVar25 = (BaseType)*(char *)((long)piVar12 + (ulong)uVar21);
            }
            if (uVar6 < 0xb) {
              uVar6 = 0;
            }
            else {
              uVar6 = *(ushort *)((long)piVar20 + lVar13 + 10);
            }
            if (uVar6 == 0) {
              uVar22 = 0;
            }
            else {
              uVar22 = (ulong)*(ushort *)((long)piVar20 + (ulong)uVar6);
            }
            dVar3 = GetAnyValueF(BVar25,(uint8_t *)(pTVar14 + uVar22));
            TestEq<double,float>
                      (dVar3,3.0,
                       "\'flatbuffers::GetAnyFieldF(*pos_struct, *pos_table_ptr->fields()->LookupByKey(\"z\"))\' != \'3.0f\'"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                       ,0x86,"");
            if (*(ushort *)(pSVar9 + -(long)*(int *)pSVar9) < 7) {
              uVar6 = 0;
            }
            else {
              uVar6 = *(ushort *)(pSVar27 + ((lVar15 + 10) - (long)*(int *)pSVar9));
            }
            local_1e8._0_8_ = "test3";
            puVar8 = (uint *)bsearch(local_1e8,
                                     pSVar9 + (ulong)*(uint *)(pSVar9 + uVar6) + 4 + (ulong)uVar6,
                                     (ulong)*(uint *)(pSVar9 + (ulong)*(uint *)(pSVar9 + uVar6) + 4
                                                               + (ulong)uVar6 + -4),4,
                                     Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::
                                     KeyCompare<char_const*>);
            if (puVar8 == (uint *)0x0) {
              piVar20 = (int *)0x0;
            }
            else {
              piVar20 = (int *)((ulong)*puVar8 + (long)puVar8);
            }
            lVar15 = -(long)*piVar20;
            uVar6 = *(ushort *)((long)piVar20 - (long)*piVar20);
            if (uVar6 < 7) {
              uVar21 = 0;
            }
            else {
              uVar21 = *(ushort *)((long)piVar20 + lVar15 + 6);
            }
            if (uVar21 == 0) {
              piVar12 = (int *)0x0;
            }
            else {
              piVar12 = (int *)((long)piVar20 +
                               (ulong)*(uint *)((long)piVar20 + (ulong)uVar21) + (ulong)uVar21);
            }
            if (*(ushort *)((long)piVar12 - (long)*piVar12) < 5) {
              uVar21 = 0;
            }
            else {
              uVar21 = *(ushort *)((long)piVar12 + (4 - (long)*piVar12));
            }
            if ((uVar21 == 0) || (*(char *)((long)piVar12 + (ulong)uVar21) != '\x0f')) {
              __assert_fail("field.type()->base_type() == reflection::Obj",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                            ,0xb2,
                            "const Struct *flatbuffers::GetFieldStruct(const Struct &, const reflection::Field &)"
                           );
            }
            if (uVar6 < 0xb) {
              uVar6 = 0;
            }
            else {
              uVar6 = *(ushort *)((long)piVar20 + lVar15 + 10);
            }
            if (uVar6 == 0) {
              uVar22 = 0;
            }
            else {
              uVar22 = (ulong)*(ushort *)((long)piVar20 + (ulong)uVar6);
            }
            TestEq<bool,bool>(true,pTVar14 != (Table *)0x0,"\'nullptr\' == \'test3_struct\'",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                              ,0x8a,"");
            pSVar27 = local_220;
            if (*(ushort *)(schema + -(long)*(int *)schema) < 5) {
              uVar6 = 0;
            }
            else {
              uVar6 = *(ushort *)(schema + (4 - (long)*(int *)schema));
            }
            if (uVar6 == 0) {
              pSVar9 = (Schema *)0x0;
            }
            else {
              pSVar9 = schema + (ulong)*(uint *)(schema + uVar6) + (ulong)uVar6;
            }
            if (*(ushort *)((long)piVar20 - (long)*piVar20) < 7) {
              uVar6 = 0;
            }
            else {
              uVar6 = *(ushort *)((long)piVar20 + (6 - (long)*piVar20));
            }
            if (uVar6 == 0) {
              piVar20 = (int *)0x0;
            }
            else {
              piVar20 = (int *)((long)piVar20 +
                               (ulong)*(uint *)((long)piVar20 + (ulong)uVar6) + (ulong)uVar6);
            }
            if (*(ushort *)((long)piVar20 - (long)*piVar20) < 9) {
              uVar6 = 0;
            }
            else {
              uVar6 = *(ushort *)((long)piVar20 + (8 - (long)*piVar20));
            }
            if (uVar6 == 0) {
              uVar26 = 0xffffffff;
            }
            else {
              uVar26 = *(uint *)((long)piVar20 + (ulong)uVar6);
            }
            if (uVar26 < *(uint *)pSVar9) {
              lVar15 = (ulong)*(uint *)(pSVar9 + (ulong)(uVar26 << 2) + 4) + (ulong)(uVar26 << 2);
              pSVar24 = pSVar9 + lVar15 + 4;
              if (*(ushort *)(pSVar24 + -(long)*(int *)pSVar24) < 7) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)(pSVar9 + ((lVar15 + 10) - (long)*(int *)pSVar24));
              }
              local_1e8._0_8_ = "a";
              puVar8 = (uint *)bsearch(local_1e8,
                                       pSVar24 + (ulong)*(uint *)(pSVar24 + uVar6) + 4 +
                                                 (ulong)uVar6,
                                       (ulong)*(uint *)(pSVar24 + (ulong)*(uint *)(pSVar24 + uVar6)
                                                                  + 4 + (ulong)uVar6 + -4),4,
                                       Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::
                                       KeyCompare<char_const*>);
              if (puVar8 == (uint *)0x0) {
                piVar20 = (int *)0x0;
              }
              else {
                piVar20 = (int *)((ulong)*puVar8 + (long)puVar8);
              }
              lVar15 = -(long)*piVar20;
              uVar6 = *(ushort *)((long)piVar20 - (long)*piVar20);
              if (uVar6 < 7) {
                uVar21 = 0;
              }
              else {
                uVar21 = *(ushort *)((long)piVar20 + lVar15 + 6);
              }
              if (uVar21 == 0) {
                piVar12 = (int *)0x0;
              }
              else {
                piVar12 = (int *)((long)piVar20 +
                                 (ulong)*(uint *)((long)piVar20 + (ulong)uVar21) + (ulong)uVar21);
              }
              BVar25 = None;
              uVar21 = 0;
              if (4 < *(ushort *)((long)piVar12 - (long)*piVar12)) {
                uVar21 = *(ushort *)((long)piVar12 + (4 - (long)*piVar12));
              }
              if (uVar21 != 0) {
                BVar25 = (BaseType)*(char *)((long)piVar12 + (ulong)uVar21);
              }
              if (uVar6 < 0xb) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)((long)piVar20 + lVar15 + 10);
              }
              if (uVar6 == 0) {
                uVar16 = 0;
              }
              else {
                uVar16 = (ulong)*(ushort *)((long)piVar20 + (ulong)uVar6);
              }
              dVar3 = GetAnyValueF(BVar25,(uint8_t *)(pTVar14 + uVar16 + uVar22));
              TestEq<double,int>(dVar3,10,
                                 "\'flatbuffers::GetAnyFieldF(*test3_struct, *test3_object->fields()->LookupByKey(\"a\"))\' != \'10\'"
                                 ,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                 ,0x8f,"");
              SetField<unsigned_short>(pTVar10,(Field *)table,200);
              uVar7 = GetFieldI<unsigned_short>(pTVar10,(Field *)table);
              TestEq<unsigned_short,int>
                        (uVar7,200,"\'hp\' != \'200\'",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                         ,0x94,"");
              lVar15 = -(long)*(int *)table;
              if (*(ushort *)(table + -(long)*(int *)table) < 0xb) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)(table + lVar15 + 10);
              }
              if (uVar6 == 0) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)(table + uVar6);
              }
              if (uVar6 < *(ushort *)(pTVar10 + -(long)*(int *)pTVar10)) {
                uVar6 = *(ushort *)(pTVar10 + ((ulong)uVar6 - (long)*(int *)pTVar10));
              }
              else {
                uVar6 = 0;
              }
              if (uVar6 == 0) {
                GetFieldDefaultI<long>((Field *)table);
              }
              else {
                if (*(ushort *)(table + -(long)*(int *)table) < 7) {
                  uVar21 = 0;
                }
                else {
                  uVar21 = *(ushort *)(table + lVar15 + 6);
                }
                if (uVar21 == 0) {
                  pTVar14 = (Table *)0x0;
                }
                else {
                  pTVar14 = table + (ulong)*(uint *)(table + uVar21) + (ulong)uVar21;
                }
                BVar25 = None;
                uVar21 = 0;
                if (4 < *(ushort *)(pTVar14 + -(long)*(int *)pTVar14)) {
                  uVar21 = *(ushort *)(pTVar14 + (4 - (long)*(int *)pTVar14));
                }
                if (uVar21 != 0) {
                  BVar25 = (BaseType)(char)pTVar14[uVar21];
                }
                SetAnyValueI(BVar25,(uint8_t *)(pTVar10 + uVar6),300);
              }
              lVar15 = -(long)*(int *)table;
              uVar6 = *(ushort *)(table + -(long)*(int *)table);
              if (uVar6 < 0xb) {
                uVar21 = 0;
              }
              else {
                uVar21 = *(ushort *)(table + lVar15 + 10);
              }
              if (uVar21 == 0) {
                uVar21 = 0;
              }
              else {
                uVar21 = *(ushort *)(table + uVar21);
              }
              if (uVar21 < *(ushort *)(pTVar10 + -(long)*(int *)pTVar10)) {
                uVar21 = *(ushort *)(pTVar10 + ((ulong)uVar21 - (long)*(int *)pTVar10));
              }
              else {
                uVar21 = 0;
              }
              if (uVar21 == 0) {
                if (uVar6 < 0xd) {
                  uVar6 = 0;
                }
                else {
                  uVar6 = *(ushort *)(table + lVar15 + 0xc);
                }
                if (uVar6 == 0) {
                  lVar15 = 0;
                }
                else {
                  lVar15 = *(long *)(table + uVar6);
                }
              }
              else {
                if (uVar6 < 7) {
                  uVar6 = 0;
                }
                else {
                  uVar6 = *(ushort *)(table + lVar15 + 6);
                }
                if (uVar6 == 0) {
                  pTVar14 = (Table *)0x0;
                }
                else {
                  pTVar14 = table + (ulong)*(uint *)(table + uVar6) + (ulong)uVar6;
                }
                BVar25 = None;
                uVar6 = 0;
                if (4 < *(ushort *)(pTVar14 + -(long)*(int *)pTVar14)) {
                  uVar6 = *(ushort *)(pTVar14 + (4 - (long)*(int *)pTVar14));
                }
                if (uVar6 != 0) {
                  BVar25 = (BaseType)(char)pTVar14[uVar6];
                }
                lVar15 = GetAnyValueI(BVar25,(uint8_t *)(pTVar10 + uVar21));
              }
              TestEq<long,int>(lVar15,300,"\'hp_int64\' != \'300\'",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                               ,0x99,"");
              lVar15 = -(long)*(int *)table;
              if (*(ushort *)(table + -(long)*(int *)table) < 0xb) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)(table + lVar15 + 10);
              }
              if (uVar6 == 0) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)(table + uVar6);
              }
              if (uVar6 < *(ushort *)(pTVar10 + -(long)*(int *)pTVar10)) {
                uVar6 = *(ushort *)(pTVar10 + ((ulong)uVar6 - (long)*(int *)pTVar10));
              }
              else {
                uVar6 = 0;
              }
              if (uVar6 == 0) {
                GetFieldDefaultF<double>((Field *)table);
              }
              else {
                if (*(ushort *)(table + -(long)*(int *)table) < 7) {
                  uVar21 = 0;
                }
                else {
                  uVar21 = *(ushort *)(table + lVar15 + 6);
                }
                if (uVar21 == 0) {
                  pTVar14 = (Table *)0x0;
                }
                else {
                  pTVar14 = table + (ulong)*(uint *)(table + uVar21) + (ulong)uVar21;
                }
                BVar25 = None;
                uVar21 = 0;
                if (4 < *(ushort *)(pTVar14 + -(long)*(int *)pTVar14)) {
                  uVar21 = *(ushort *)(pTVar14 + (4 - (long)*(int *)pTVar14));
                }
                if (uVar21 != 0) {
                  BVar25 = (BaseType)(char)pTVar14[uVar21];
                }
                SetAnyValueF(BVar25,(uint8_t *)(pTVar10 + uVar6),300.5);
              }
              lVar15 = -(long)*(int *)table;
              uVar6 = *(ushort *)(table + -(long)*(int *)table);
              if (uVar6 < 0xb) {
                uVar21 = 0;
              }
              else {
                uVar21 = *(ushort *)(table + lVar15 + 10);
              }
              if (uVar21 == 0) {
                uVar21 = 0;
              }
              else {
                uVar21 = *(ushort *)(table + uVar21);
              }
              if (uVar21 < *(ushort *)(pTVar10 + -(long)*(int *)pTVar10)) {
                uVar21 = *(ushort *)(pTVar10 + ((ulong)uVar21 - (long)*(int *)pTVar10));
              }
              else {
                uVar21 = 0;
              }
              if (uVar21 == 0) {
                if (uVar6 < 0xd) {
                  uVar6 = 0;
                }
                else {
                  uVar6 = *(ushort *)(table + lVar15 + 0xc);
                }
                if (uVar6 == 0) {
                  lVar15 = 0;
                }
                else {
                  lVar15 = *(long *)(table + uVar6);
                }
              }
              else {
                if (uVar6 < 7) {
                  uVar6 = 0;
                }
                else {
                  uVar6 = *(ushort *)(table + lVar15 + 6);
                }
                if (uVar6 == 0) {
                  pTVar14 = (Table *)0x0;
                }
                else {
                  pTVar14 = table + (ulong)*(uint *)(table + uVar6) + (ulong)uVar6;
                }
                BVar25 = None;
                uVar6 = 0;
                if (4 < *(ushort *)(pTVar14 + -(long)*(int *)pTVar14)) {
                  uVar6 = *(ushort *)(pTVar14 + (4 - (long)*(int *)pTVar14));
                }
                if (uVar6 != 0) {
                  BVar25 = (BaseType)(char)pTVar14[uVar6];
                }
                lVar15 = GetAnyValueI(BVar25,(uint8_t *)(pTVar10 + uVar21));
              }
              TestEq<long,int>(lVar15,300,"\'hp_int64\' != \'300\'",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                               ,0x9c,"");
              lVar15 = -(long)*(int *)table;
              if (*(ushort *)(table + -(long)*(int *)table) < 0xb) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)(table + lVar15 + 10);
              }
              if (uVar6 == 0) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)(table + uVar6);
              }
              if (uVar6 < *(ushort *)(pTVar10 + -(long)*(int *)pTVar10)) {
                uVar6 = *(ushort *)(pTVar10 + ((ulong)uVar6 - (long)*(int *)pTVar10));
              }
              else {
                uVar6 = 0;
              }
              if (uVar6 != 0) {
                if (*(ushort *)(table + -(long)*(int *)table) < 7) {
                  uVar21 = 0;
                }
                else {
                  uVar21 = *(ushort *)(table + lVar15 + 6);
                }
                if (uVar21 == 0) {
                  pTVar14 = (Table *)0x0;
                }
                else {
                  pTVar14 = table + (ulong)*(uint *)(table + uVar21) + (ulong)uVar21;
                }
                BVar25 = None;
                uVar21 = 0;
                if (4 < *(ushort *)(pTVar14 + -(long)*(int *)pTVar14)) {
                  uVar21 = *(ushort *)(pTVar14 + (4 - (long)*(int *)pTVar14));
                }
                if (uVar21 != 0) {
                  BVar25 = (BaseType)(char)pTVar14[uVar21];
                }
                SetAnyValueS(BVar25,(uint8_t *)(pTVar10 + uVar6),"300");
              }
              lVar15 = -(long)*(int *)table;
              uVar6 = *(ushort *)(table + -(long)*(int *)table);
              if (uVar6 < 0xb) {
                uVar21 = 0;
              }
              else {
                uVar21 = *(ushort *)(table + lVar15 + 10);
              }
              if (uVar21 == 0) {
                uVar21 = 0;
              }
              else {
                uVar21 = *(ushort *)(table + uVar21);
              }
              if (uVar21 < *(ushort *)(pTVar10 + -(long)*(int *)pTVar10)) {
                uVar21 = *(ushort *)(pTVar10 + ((ulong)uVar21 - (long)*(int *)pTVar10));
              }
              else {
                uVar21 = 0;
              }
              if (uVar21 == 0) {
                if (uVar6 < 0xd) {
                  uVar6 = 0;
                }
                else {
                  uVar6 = *(ushort *)(table + lVar15 + 0xc);
                }
                if (uVar6 == 0) {
                  lVar15 = 0;
                }
                else {
                  lVar15 = *(long *)(table + uVar6);
                }
              }
              else {
                if (uVar6 < 7) {
                  uVar6 = 0;
                }
                else {
                  uVar6 = *(ushort *)(table + lVar15 + 6);
                }
                if (uVar6 == 0) {
                  pTVar14 = (Table *)0x0;
                }
                else {
                  pTVar14 = table + (ulong)*(uint *)(table + uVar6) + (ulong)uVar6;
                }
                BVar25 = None;
                uVar6 = 0;
                if (4 < *(ushort *)(pTVar14 + -(long)*(int *)pTVar14)) {
                  uVar6 = *(ushort *)(pTVar14 + (4 - (long)*(int *)pTVar14));
                }
                if (uVar6 != 0) {
                  BVar25 = (BaseType)(char)pTVar14[uVar6];
                }
                lVar15 = GetAnyValueI(BVar25,(uint8_t *)(pTVar10 + uVar21));
              }
              TestEq<long,int>(lVar15,300,"\'hp_int64\' != \'300\'",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                               ,0x9f,"");
              if (*(ushort *)(schema + -(long)*(int *)schema) < 0xd) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)(schema + (0xc - (long)*(int *)schema));
              }
              bVar5 = flatbuffers::Verify(schema,(Object *)
                                                 (schema + (ulong)*(uint *)(schema + uVar6) +
                                                           (ulong)uVar6),(uint8_t *)local_218,
                                          local_210,0x40,1000000);
              TestEq<bool,bool>(bVar5,true,
                                "\'flatbuffers::Verify(schema, *schema.root_table(), flatbuf, length)\' != \'true\'"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                ,0xa3,"");
              SetField<unsigned_short>(pTVar10,(Field *)table,0x50);
              puVar8 = local_218;
              std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_240,
                         (uchar *)local_218,(uchar *)(local_210 + (long)local_218),
                         (allocator_type *)local_1e8);
              local_1e8._0_8_ = "name";
              puVar17 = (uint *)bsearch(local_1e8,local_228,(ulong)*(uint *)pSVar27,4,
                                        Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>
                                        ::KeyCompare<char_const*>);
              puVar4 = local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if (puVar17 == (uint *)0x0) {
                piVar20 = (int *)0x0;
              }
              else {
                piVar20 = (int *)((ulong)*puVar17 + (long)puVar17);
              }
              if ((uint *)local_240.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start == (uint *)0x0) {
                lVar15 = 0;
              }
              else {
                lVar15 = (ulong)*(uint *)local_240.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                         (long)local_240.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start;
              }
              local_1e8._0_8_ = local_1e8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1e8,"totally new string","");
              lVar13 = -(long)*piVar20;
              uVar6 = *(ushort *)((long)piVar20 - (long)*piVar20);
              if (uVar6 < 7) {
                uVar21 = 0;
              }
              else {
                uVar21 = *(ushort *)((long)piVar20 + lVar13 + 6);
              }
              if (uVar21 == 0) {
                piVar12 = (int *)0x0;
              }
              else {
                piVar12 = (int *)((long)piVar20 +
                                 (ulong)*(uint *)((long)piVar20 + (ulong)uVar21) + (ulong)uVar21);
              }
              if (*(ushort *)((long)piVar12 - (long)*piVar12) < 5) {
                uVar21 = 0;
              }
              else {
                uVar21 = *(ushort *)((long)piVar12 + (4 - (long)*piVar12));
              }
              if ((uVar21 == 0) || (*(char *)((long)piVar12 + (ulong)uVar21) != '\r')) {
LAB_00191b44:
                __assert_fail("field.type()->base_type() == reflection::String",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                              ,0x8b,
                              "const String *flatbuffers::GetFieldS(const Table &, const reflection::Field &)"
                             );
              }
              lVar15 = lVar15 - (long)puVar4;
              if (uVar6 < 0xb) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)((long)piVar20 + lVar13 + 10);
              }
              piVar12 = (int *)((long)local_240.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar15);
              if (uVar6 == 0) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)((long)piVar20 + (ulong)uVar6);
              }
              if (uVar6 < *(ushort *)((long)piVar12 - (long)*piVar12)) {
                uVar6 = *(ushort *)((long)piVar12 + ((ulong)uVar6 - (long)*piVar12));
              }
              else {
                uVar6 = 0;
              }
              if (uVar6 == 0) {
                str = (String *)0x0;
              }
              else {
                str = (String *)
                      ((long)piVar12 + (ulong)*(uint *)((long)piVar12 + (ulong)uVar6) + (ulong)uVar6
                      );
              }
              SetString(schema,(string *)local_1e8,str,&local_240,(Object *)0x0);
              if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
                operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
              }
              lVar13 = -(long)*piVar20;
              uVar6 = *(ushort *)((long)piVar20 - (long)*piVar20);
              if (uVar6 < 7) {
                uVar21 = 0;
              }
              else {
                uVar21 = *(ushort *)((long)piVar20 + lVar13 + 6);
              }
              if (uVar21 == 0) {
                piVar12 = (int *)0x0;
              }
              else {
                piVar12 = (int *)((long)piVar20 +
                                 (ulong)*(uint *)((long)piVar20 + (ulong)uVar21) + (ulong)uVar21);
              }
              if (*(ushort *)((long)piVar12 - (long)*piVar12) < 5) {
                uVar21 = 0;
              }
              else {
                uVar21 = *(ushort *)((long)piVar12 + (4 - (long)*piVar12));
              }
              if ((uVar21 == 0) || (*(char *)((long)piVar12 + (ulong)uVar21) != '\r'))
              goto LAB_00191b44;
              if (uVar6 < 0xb) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)((long)piVar20 + lVar13 + 10);
              }
              piVar12 = (int *)((long)local_240.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar15);
              if (uVar6 == 0) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)((long)piVar20 + (ulong)uVar6);
              }
              if (uVar6 < *(ushort *)((long)piVar12 - (long)*piVar12)) {
                uVar6 = *(ushort *)((long)piVar12 + ((ulong)uVar6 - (long)*piVar12));
              }
              else {
                uVar6 = 0;
              }
              TestEqStr((char *)((long)piVar12 +
                                (ulong)*(uint *)((long)piVar12 + (ulong)uVar6) + (ulong)uVar6 + 4),
                        "totally new string",
                        "\'GetFieldS(**rroot, name_field)->c_str()\' != \'\"totally new string\"\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                        ,0xb5,"");
              local_1e8._0_8_ = "inventory";
              puVar17 = (uint *)bsearch(local_1e8,local_228,(ulong)*(uint *)pSVar27,4,
                                        Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>
                                        ::KeyCompare<char_const*>);
              vec = GetFieldV<unsigned_char>
                              ((Table *)((long)local_240.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start + lVar15),
                               (Field *)((ulong)*puVar17 + (long)puVar17));
              lVar13 = (long)vec -
                       (long)local_240.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
              num_elems = *(uoffset_t *)vec;
              puVar18 = ResizeAnyVector(schema,0x6e,(VectorOfAny *)vec,num_elems,1,&local_240,
                                        (Object *)0x0);
              if ((int)num_elems < 0x6e) {
                memset(puVar18,0x32,(ulong)(0x6d - num_elems) + 1);
              }
              if (*(uint *)((long)local_240.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar13) < 0xb) {
                __function = 
                "return_type flatbuffers::Vector<unsigned char>::Get(SizeT) const [T = unsigned char, SizeT = unsigned int]"
                ;
                goto LAB_00191c06;
              }
              TestEq<unsigned_char,int>
                        (*(uchar *)((long)local_240.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar13 + 0xe),
                         0x32,"\'rinventory->Get(10)\' != \'50\'",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                         ,0xbd,"");
              local_1e8._0_8_ = "testarrayofstring";
              puVar17 = (uint *)bsearch(local_1e8,local_228,(ulong)*(uint *)local_220,4,
                                        Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>
                                        ::KeyCompare<char_const*>);
              vec_00 = GetFieldV<flatbuffers::Offset<flatbuffers::String>>
                                 ((Table *)((long)local_240.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar15
                                           ),(Field *)((ulong)*puVar17 + (long)puVar17));
              lVar13 = (long)vec_00 -
                       (long)local_240.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
              ResizeVector<flatbuffers::Offset<flatbuffers::String>>
                        (schema,3,(Offset<flatbuffers::String>)0x0,vec_00,&local_240,(Object *)0x0);
              local_1e8._0_8_ = (char *)0x0;
              local_1e8[8] = false;
              local_1e8._16_8_ = 0x400;
              local_1e8._24_4_ = 0x7fffffff;
              local_1c8 = 8;
              local_1c0 = 0;
              local_1b8 = 0;
              local_190 = 0;
              local_188._0_1_ = false;
              local_188._1_1_ = false;
              local_1b0 = (uint8_t *)0x0;
              uStack_1a8 = 0;
              uStack_1a2 = 0;
              uStack_1a0 = 0;
              uStack_19a = 0;
              local_180 = 1;
              local_178._0_1_ = false;
              local_178._1_1_ = true;
              local_170 = (StringOffsetMap *)0x0;
              FlatBufferBuilderImpl<false>::CreateStringImpl
                        ((FlatBufferBuilderImpl<false> *)local_1e8,"hank",4);
              FlatBufferBuilderImpl<false>::Finish
                        ((FlatBufferBuilderImpl<false> *)local_1e8,local_1b8,(char *)0x0,false);
              puVar18 = FlatBufferBuilderImpl<false>::GetBufferPointer
                                  ((FlatBufferBuilderImpl<false> *)local_1e8);
              puVar18 = AddFlatBuffer(&local_240,puVar18,(ulong)local_1b8);
              if (*(uint *)((long)local_240.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar13) < 3) {
                __assert_fail("i < size()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                              ,0x101,
                              "void flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>>::MutateOffset(SizeT, const uint8_t *) [T = flatbuffers::Offset<flatbuffers::String>, SizeT = unsigned int]"
                             );
              }
              lVar19 = (long)local_240.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar13;
              *(int *)(lVar19 + 0xc) = (int)puVar18 - ((int)lVar19 + 0xc);
              TestEqStr((char *)(lVar19 + (ulong)*(uint *)(lVar19 + 4) + 8),"bob",
                        "\'rtestarrayofstring->Get(0)->c_str()\' != \'\"bob\"\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                        ,0xd9,"");
              if (2 < *(uint *)((long)local_240.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar13)) {
                TestEqStr((char *)((long)local_240.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                  (ulong)*(uint *)((long)local_240.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  lVar13 + 0xc) + lVar13 + 0x10),"hank",
                          "\'rtestarrayofstring->Get(2)->c_str()\' != \'\"hank\"\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                          ,0xda,"");
                local_140.size_ =
                     (long)local_240.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_240.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
                local_140.buf_ =
                     local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                local_140.opts_.max_depth = 0x40;
                local_140.opts_.max_tables = 1000000;
                local_140.opts_.check_alignment = true;
                local_140.opts_.check_nested_flatbuffers = true;
                local_140.opts_.max_size = 0x7fffffff;
                local_140.opts_.assert = false;
                local_140.upper_bound_ = 0;
                local_140.depth_ = 0;
                local_140.num_tables_ = 0;
                local_140.flex_reuse_tracker_ =
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
                if (0x7ffffffe < local_140.size_) goto LAB_00191b7d;
                bVar5 = VerifierTemplate<false>::VerifyBufferFromStart<MyGame::Example::Monster>
                                  (&local_140,"MONS",0);
                TestEq<bool,bool>(bVar5,true,"\'VerifyMonsterBuffer(resize_verifier)\' != \'true\'",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                  ,0xdf,"");
                if (*(ushort *)(schema + -(long)*(int *)schema) < 0xd) {
                  uVar6 = 0;
                }
                else {
                  uVar6 = *(ushort *)(schema + (0xc - (long)*(int *)schema));
                }
                bVar5 = flatbuffers::Verify(schema,(Object *)
                                                   (schema + (ulong)*(uint *)(schema + uVar6) +
                                                             (ulong)uVar6),
                                            local_240.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_240.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_240.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,0x40,
                                            1000000);
                TestEq<bool,bool>(bVar5,true,
                                  "\'flatbuffers::Verify(schema, *schema.root_table(), resizingbuf.data(), resizingbuf.size())\' != \'true\'"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                  ,0xe4,"");
                lVar13 = -(long)*piVar20;
                uVar6 = *(ushort *)((long)piVar20 - (long)*piVar20);
                if (uVar6 < 7) {
                  uVar21 = 0;
                }
                else {
                  uVar21 = *(ushort *)((long)piVar20 + lVar13 + 6);
                }
                if (uVar21 == 0) {
                  piVar12 = (int *)0x0;
                }
                else {
                  piVar12 = (int *)((long)piVar20 +
                                   (ulong)*(uint *)((long)piVar20 + (ulong)uVar21) + (ulong)uVar21);
                }
                if (*(ushort *)((long)piVar12 - (long)*piVar12) < 5) {
                  uVar21 = 0;
                }
                else {
                  uVar21 = *(ushort *)((long)piVar12 + (4 - (long)*piVar12));
                }
                if (uVar21 == 0) {
                  uVar22 = 0;
                }
                else {
                  uVar22 = (ulong)(uint)(int)*(char *)((long)piVar12 + (ulong)uVar21);
                }
                if ((&GetTypeSize(reflection::BaseType)::sizes)[uVar22] != 4) {
                  __assert_fail("sizeof(uoffset_t) == GetTypeSize(field.type()->base_type())",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                                ,0x1e7,
                                "bool flatbuffers::SetFieldT(Table *, const reflection::Field &, const uint8_t *)"
                               );
                }
                if (uVar6 < 0xb) {
                  uVar6 = 0;
                }
                else {
                  uVar6 = *(ushort *)((long)piVar20 + lVar13 + 10);
                }
                piVar12 = (int *)(lVar15 + (long)local_240.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start);
                if (uVar6 == 0) {
                  uVar6 = 0;
                }
                else {
                  uVar6 = *(ushort *)((long)piVar20 + (ulong)uVar6);
                }
                if (uVar6 < *(ushort *)((long)piVar12 - (long)*piVar12)) {
                  uVar6 = *(ushort *)((long)piVar12 + ((ulong)uVar6 - (long)*piVar12));
                }
                else {
                  uVar6 = 0;
                }
                if (uVar6 != 0) {
                  *(uint *)((long)piVar12 + (ulong)uVar6) =
                       (int)puVar18 - ((int)piVar12 + (uint)uVar6);
                }
                lVar15 = -(long)*piVar20;
                uVar6 = *(ushort *)((long)piVar20 - (long)*piVar20);
                if (uVar6 < 7) {
                  uVar21 = 0;
                }
                else {
                  uVar21 = *(ushort *)((long)piVar20 + lVar15 + 6);
                }
                if (uVar21 == 0) {
                  piVar23 = (int *)0x0;
                }
                else {
                  piVar23 = (int *)((long)piVar20 +
                                   (ulong)*(uint *)((long)piVar20 + (ulong)uVar21) + (ulong)uVar21);
                }
                if (*(ushort *)((long)piVar23 - (long)*piVar23) < 5) {
                  uVar21 = 0;
                }
                else {
                  uVar21 = *(ushort *)((long)piVar23 + (4 - (long)*piVar23));
                }
                if ((uVar21 != 0) && (*(char *)((long)piVar23 + (ulong)uVar21) == '\r')) {
                  if (uVar6 < 0xb) {
                    uVar6 = 0;
                  }
                  else {
                    uVar6 = *(ushort *)((long)piVar20 + lVar15 + 10);
                  }
                  if (uVar6 == 0) {
                    uVar6 = 0;
                  }
                  else {
                    uVar6 = *(ushort *)((long)piVar20 + (ulong)uVar6);
                  }
                  if (uVar6 < *(ushort *)((long)piVar12 - (long)*piVar12)) {
                    uVar6 = *(ushort *)((long)piVar12 + ((ulong)uVar6 - (long)*piVar12));
                  }
                  else {
                    uVar6 = 0;
                  }
                  TestEqStr((char *)((long)piVar12 +
                                    (ulong)*(uint *)((long)piVar12 + (ulong)uVar6) + (ulong)uVar6 +
                                    4),"hank",
                            "\'GetFieldS(**rroot, name_field)->c_str()\' != \'\"hank\"\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                            ,0xea,"");
                  local_b0.buf_.allocator_ = (Allocator *)0x0;
                  local_b0.buf_.own_allocator_ = false;
                  local_b0.buf_.initial_size_ = 0x400;
                  local_b0.buf_.max_size_ = 0x7fffffff;
                  local_b0.buf_.buffer_minalign_ = 8;
                  local_b0.buf_.reserved_ = 0;
                  local_b0.buf_.size_ = 0;
                  local_b0.length_of_64_bit_region_ = 0;
                  local_b0.nested = false;
                  local_b0.finished = false;
                  local_b0.buf_.buf_ = (uint8_t *)0x0;
                  local_b0.buf_.cur_._0_6_ = 0;
                  local_b0.buf_.cur_._6_2_ = 0;
                  local_b0.buf_.scratch_._0_6_ = 0;
                  local_b0._78_8_ = 0;
                  local_b0.minalign_ = 1;
                  local_b0.force_defaults_ = false;
                  local_b0.dedup_vtables_ = true;
                  local_b0.string_pool = (StringOffsetMap *)0x0;
                  root = CopyTable(&local_b0,schema,(Object *)local_168,
                                   (Table *)((ulong)*puVar8 + (long)puVar8),true);
                  FlatBufferBuilderImpl<false>::Finish(&local_b0,root.o,"MONS",false);
                  puVar18 = FlatBufferBuilderImpl<false>::GetBufferPointer(&local_b0);
                  AccessFlatBufferTest(puVar18,(ulong)local_b0.buf_.size_,true);
                  if (*(ushort *)(schema + -(long)*(int *)schema) < 0xd) {
                    uVar6 = 0;
                  }
                  else {
                    uVar6 = *(ushort *)(schema + (0xc - (long)*(int *)schema));
                  }
                  if (uVar6 == 0) {
                    root_00 = (Object *)0x0;
                  }
                  else {
                    root_00 = (Object *)(schema + (ulong)*(uint *)(schema + uVar6) + (ulong)uVar6);
                  }
                  puVar18 = FlatBufferBuilderImpl<false>::GetBufferPointer(&local_b0);
                  bVar5 = flatbuffers::Verify(schema,root_00,puVar18,(ulong)local_b0.buf_.size_,0x40
                                              ,1000000);
                  TestEq<bool,bool>(bVar5,true,
                                    "\'flatbuffers::Verify(schema, *schema.root_table(), fbb.GetBufferPointer(), fbb.GetSize())\' != \'true\'"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                    ,0xf9,"");
                  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_b0);
                  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl
                            ((FlatBufferBuilderImpl<false> *)local_1e8);
                  if ((uint *)local_240.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start != (uint *)0x0) {
                    operator_delete(local_240.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_240.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_240.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_160._M_dataplus._M_p != &local_160.field_2) {
                    operator_delete(local_160._M_dataplus._M_p,
                                    local_160.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208._M_dataplus._M_p != &local_208.field_2) {
                    operator_delete(local_208._M_dataplus._M_p,
                                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                             local_208.field_2._M_local_buf[0]) + 1);
                  }
                  return;
                }
                goto LAB_00191b44;
              }
              goto LAB_00191b2a;
            }
          }
          __function = 
          "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
          ;
          goto LAB_00191c06;
        }
      }
    }
LAB_00191b2a:
    __function = 
    "return_type flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>>::Get(SizeT) const [T = flatbuffers::Offset<flatbuffers::String>, SizeT = unsigned int]"
    ;
  }
LAB_00191c06:
  __assert_fail("i < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                ,0xc1,__function);
}

Assistant:

void ReflectionTest(const std::string &tests_data_path, uint8_t *flatbuf,
                    size_t length) {
  // Load a binary schema.
  std::string bfbsfile;
  TEST_EQ(flatbuffers::LoadFile((tests_data_path + "monster_test.bfbs").c_str(),
                                true, &bfbsfile),
          true);

  // Verify it, just in case:
  flatbuffers::Verifier verifier(
      reinterpret_cast<const uint8_t *>(bfbsfile.c_str()), bfbsfile.length());
  TEST_EQ(reflection::VerifySchemaBuffer(verifier), true);

  // Make sure the schema is what we expect it to be.
  auto &schema = *reflection::GetSchema(bfbsfile.c_str());
  auto root_table = schema.root_table();

  // Check the declaration files.
  TEST_EQ_STR(root_table->name()->c_str(), "MyGame.Example.Monster");
  TEST_EQ_STR(root_table->declaration_file()->c_str(), "//monster_test.fbs");
  TEST_EQ_STR(
      schema.objects()->LookupByKey("TableA")->declaration_file()->c_str(),
      "//include_test/include_test1.fbs");
  TEST_EQ_STR(schema.objects()
                  ->LookupByKey("MyGame.OtherNameSpace.Unused")
                  ->declaration_file()
                  ->c_str(),
              "//include_test/sub/include_test2.fbs");
  TEST_EQ_STR(schema.enums()
                  ->LookupByKey("MyGame.OtherNameSpace.FromInclude")
                  ->declaration_file()
                  ->c_str(),
              "//include_test/sub/include_test2.fbs");

  // Check scheam filenames and their includes.
  TEST_EQ(schema.fbs_files()->size(), 3);

  const auto fbs0 = schema.fbs_files()->Get(0);
  TEST_EQ_STR(fbs0->filename()->c_str(), "//include_test/include_test1.fbs");
  const auto fbs0_includes = fbs0->included_filenames();
  TEST_EQ(fbs0_includes->size(), 2);

  // TODO(caspern): Should we force or disallow inclusion of self?
  TEST_EQ_STR(fbs0_includes->Get(0)->c_str(),
              "//include_test/include_test1.fbs");
  TEST_EQ_STR(fbs0_includes->Get(1)->c_str(),
              "//include_test/sub/include_test2.fbs");

  const auto fbs1 = schema.fbs_files()->Get(1);
  TEST_EQ_STR(fbs1->filename()->c_str(),
              "//include_test/sub/include_test2.fbs");
  const auto fbs1_includes = fbs1->included_filenames();
  TEST_EQ(fbs1_includes->size(), 2);
  TEST_EQ_STR(fbs1_includes->Get(0)->c_str(),
              "//include_test/include_test1.fbs");
  TEST_EQ_STR(fbs1_includes->Get(1)->c_str(),
              "//include_test/sub/include_test2.fbs");

  const auto fbs2 = schema.fbs_files()->Get(2);
  TEST_EQ_STR(fbs2->filename()->c_str(), "//monster_test.fbs");
  const auto fbs2_includes = fbs2->included_filenames();
  TEST_EQ(fbs2_includes->size(), 1);
  TEST_EQ_STR(fbs2_includes->Get(0)->c_str(),
              "//include_test/include_test1.fbs");

  // Check Root table fields
  auto fields = root_table->fields();
  auto hp_field_ptr = fields->LookupByKey("hp");
  TEST_NOTNULL(hp_field_ptr);
  auto &hp_field = *hp_field_ptr;
  TEST_EQ_STR(hp_field.name()->c_str(), "hp");
  TEST_EQ(hp_field.id(), 2);
  TEST_EQ(hp_field.type()->base_type(), reflection::Short);

  auto friendly_field_ptr = fields->LookupByKey("friendly");
  TEST_NOTNULL(friendly_field_ptr);
  TEST_NOTNULL(friendly_field_ptr->attributes());
  TEST_NOTNULL(friendly_field_ptr->attributes()->LookupByKey("priority"));

  // Make sure the table index is what we expect it to be.
  auto pos_field_ptr = fields->LookupByKey("pos");
  TEST_NOTNULL(pos_field_ptr);
  TEST_EQ(pos_field_ptr->type()->base_type(), reflection::Obj);
  auto pos_table_ptr = schema.objects()->Get(pos_field_ptr->type()->index());
  TEST_NOTNULL(pos_table_ptr);
  TEST_EQ_STR(pos_table_ptr->name()->c_str(), "MyGame.Example.Vec3");

  // Test nullability of fields: hp is a 0-default scalar, pos is a struct =>
  // optional, and name is a required string => not optional.
  TEST_EQ(hp_field.optional(), false);
  TEST_EQ(pos_field_ptr->optional(), true);
  TEST_EQ(fields->LookupByKey("name")->optional(), false);

  // Now use it to dynamically access a buffer.
  auto &root = *flatbuffers::GetAnyRoot(flatbuf);

  // Verify the buffer first using reflection based verification
  TEST_EQ(flatbuffers::Verify(schema, *schema.root_table(), flatbuf, length),
          true);

  auto hp = flatbuffers::GetFieldI<uint16_t>(root, hp_field);
  TEST_EQ(hp, 80);

  // Rather than needing to know the type, we can also get the value of
  // any field as an int64_t/double/string, regardless of what it actually is.
  auto hp_int64 = flatbuffers::GetAnyFieldI(root, hp_field);
  TEST_EQ(hp_int64, 80);
  auto hp_double = flatbuffers::GetAnyFieldF(root, hp_field);
  TEST_EQ(hp_double, 80.0);
  auto hp_string = flatbuffers::GetAnyFieldS(root, hp_field, &schema);
  TEST_EQ_STR(hp_string.c_str(), "80");

  // Get struct field through reflection
  auto pos_struct = flatbuffers::GetFieldStruct(root, *pos_field_ptr);
  TEST_NOTNULL(pos_struct);
  TEST_EQ(flatbuffers::GetAnyFieldF(*pos_struct,
                                    *pos_table_ptr->fields()->LookupByKey("z")),
          3.0f);

  auto test3_field = pos_table_ptr->fields()->LookupByKey("test3");
  auto test3_struct = flatbuffers::GetFieldStruct(*pos_struct, *test3_field);
  TEST_NOTNULL(test3_struct);
  auto test3_object = schema.objects()->Get(test3_field->type()->index());

  TEST_EQ(flatbuffers::GetAnyFieldF(*test3_struct,
                                    *test3_object->fields()->LookupByKey("a")),
          10);

  // We can also modify it.
  flatbuffers::SetField<uint16_t>(&root, hp_field, 200);
  hp = flatbuffers::GetFieldI<uint16_t>(root, hp_field);
  TEST_EQ(hp, 200);

  // We can also set fields generically:
  flatbuffers::SetAnyFieldI(&root, hp_field, 300);
  hp_int64 = flatbuffers::GetAnyFieldI(root, hp_field);
  TEST_EQ(hp_int64, 300);
  flatbuffers::SetAnyFieldF(&root, hp_field, 300.5);
  hp_int64 = flatbuffers::GetAnyFieldI(root, hp_field);
  TEST_EQ(hp_int64, 300);
  flatbuffers::SetAnyFieldS(&root, hp_field, "300");
  hp_int64 = flatbuffers::GetAnyFieldI(root, hp_field);
  TEST_EQ(hp_int64, 300);

  // Test buffer is valid after the modifications
  TEST_EQ(flatbuffers::Verify(schema, *schema.root_table(), flatbuf, length),
          true);

  // Reset it, for further tests.
  flatbuffers::SetField<uint16_t>(&root, hp_field, 80);

  // More advanced functionality: changing the size of items in-line!
  // First we put the FlatBuffer inside an std::vector.
  std::vector<uint8_t> resizingbuf(flatbuf, flatbuf + length);
  // Find the field we want to modify.
  auto &name_field = *fields->LookupByKey("name");
  // Get the root.
  // This time we wrap the result from GetAnyRoot in a smartpointer that
  // will keep rroot valid as resizingbuf resizes.
  auto rroot = flatbuffers::piv(flatbuffers::GetAnyRoot(resizingbuf.data()),
                                resizingbuf);
  SetString(schema, "totally new string", GetFieldS(**rroot, name_field),
            &resizingbuf);
  // Here resizingbuf has changed, but rroot is still valid.
  TEST_EQ_STR(GetFieldS(**rroot, name_field)->c_str(), "totally new string");
  // Now lets extend a vector by 100 elements (10 -> 110).
  auto &inventory_field = *fields->LookupByKey("inventory");
  auto rinventory = flatbuffers::piv(
      flatbuffers::GetFieldV<uint8_t>(**rroot, inventory_field), resizingbuf);
  flatbuffers::ResizeVector<uint8_t>(schema, 110, 50, *rinventory,
                                     &resizingbuf);
  // rinventory still valid, so lets read from it.
  TEST_EQ(rinventory->Get(10), 50);

  // For reflection uses not covered already, there is a more powerful way:
  // we can simply generate whatever object we want to add/modify in a
  // FlatBuffer of its own, then add that to an existing FlatBuffer:
  // As an example, let's add a string to an array of strings.
  // First, find our field:
  auto &testarrayofstring_field = *fields->LookupByKey("testarrayofstring");
  // Find the vector value:
  auto rtestarrayofstring = flatbuffers::piv(
      flatbuffers::GetFieldV<flatbuffers::Offset<flatbuffers::String>>(
          **rroot, testarrayofstring_field),
      resizingbuf);
  // It's a vector of 2 strings, to which we add one more, initialized to
  // offset 0.
  flatbuffers::ResizeVector<flatbuffers::Offset<flatbuffers::String>>(
      schema, 3, 0, *rtestarrayofstring, &resizingbuf);
  // Here we just create a buffer that contans a single string, but this
  // could also be any complex set of tables and other values.
  flatbuffers::FlatBufferBuilder stringfbb;
  stringfbb.Finish(stringfbb.CreateString("hank"));
  // Add the contents of it to our existing FlatBuffer.
  // We do this last, so the pointer doesn't get invalidated (since it is
  // at the end of the buffer):
  auto string_ptr = flatbuffers::AddFlatBuffer(
      resizingbuf, stringfbb.GetBufferPointer(), stringfbb.GetSize());
  // Finally, set the new value in the vector.
  rtestarrayofstring->MutateOffset(2, string_ptr);
  TEST_EQ_STR(rtestarrayofstring->Get(0)->c_str(), "bob");
  TEST_EQ_STR(rtestarrayofstring->Get(2)->c_str(), "hank");
  // Test integrity of all resize operations above.
  flatbuffers::Verifier resize_verifier(
      reinterpret_cast<const uint8_t *>(resizingbuf.data()),
      resizingbuf.size());
  TEST_EQ(VerifyMonsterBuffer(resize_verifier), true);

  // Test buffer is valid using reflection as well
  TEST_EQ(flatbuffers::Verify(schema, *schema.root_table(), resizingbuf.data(),
                              resizingbuf.size()),
          true);

  // As an additional test, also set it on the name field.
  // Note: unlike the name change above, this just overwrites the offset,
  // rather than changing the string in-place.
  SetFieldT(*rroot, name_field, string_ptr);
  TEST_EQ_STR(GetFieldS(**rroot, name_field)->c_str(), "hank");

  // Using reflection, rather than mutating binary FlatBuffers, we can also copy
  // tables and other things out of other FlatBuffers into a FlatBufferBuilder,
  // either part or whole.
  flatbuffers::FlatBufferBuilder fbb;
  auto root_offset = flatbuffers::CopyTable(
      fbb, schema, *root_table, *flatbuffers::GetAnyRoot(flatbuf), true);
  fbb.Finish(root_offset, MonsterIdentifier());
  // Test that it was copied correctly:
  AccessFlatBufferTest(fbb.GetBufferPointer(), fbb.GetSize());

  // Test buffer is valid using reflection as well
  TEST_EQ(flatbuffers::Verify(schema, *schema.root_table(),
                              fbb.GetBufferPointer(), fbb.GetSize()),
          true);
}